

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake_client.cc
# Opt level: O0

ssl_hs_wait_t bssl::do_enter_early_data(SSL_HANDSHAKE *hs)

{
  pointer psVar1;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_28;
  SSL *local_20;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  local_20 = hs->ssl;
  if ((*(uint *)&hs->field_0x6c8 >> 0xb & 1) == 0) {
    hs->state = 3;
  }
  else {
    ssl = (SSL *)hs;
    UpRef((bssl *)&local_28,&local_20->session);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator=
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(ssl + 10),&local_28);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
    psVar1 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(ssl + 10));
    local_20->s3->version = psVar1->ssl_version;
    *(uint *)&ssl[10].d1 = *(uint *)&ssl[10].d1 & 0xffffbfff | 0x4000;
    *(undefined4 *)&ssl->field_0x14 = 2;
  }
  return ssl_hs_ok;
}

Assistant:

static enum ssl_hs_wait_t do_enter_early_data(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (!hs->early_data_offered) {
    hs->state = state_read_server_hello;
    return ssl_hs_ok;
  }

  // Stash the early data session and activate the early version. This must
  // happen before |do_early_reverify_server_certificate|, so early connection
  // properties are available to the callback. Note the early version may be
  // overwritten later by the final version.
  hs->early_session = UpRef(ssl->session);
  ssl->s3->version = hs->early_session->ssl_version;
  hs->is_early_version = true;
  hs->state = state_early_reverify_server_certificate;
  return ssl_hs_ok;
}